

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawVert *pIVar4;
  ImDrawList *this;
  float fVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  int n_1;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ImGuiContext *g;
  ImGuiContext *pIVar16;
  ImVec4 *buf_00;
  ImDrawCmd *pIVar17;
  int iVar18;
  unsigned_short *puVar19;
  undefined4 uVar20;
  float in_XMM4_Da;
  float fVar21;
  undefined4 in_XMM4_Db;
  float in_XMM5_Da;
  float fVar22;
  undefined4 in_XMM5_Db;
  float in_XMM6_Da;
  float fVar23;
  float in_XMM6_Db;
  float in_XMM7_Da;
  float fVar24;
  float in_XMM7_Db;
  ImGuiListClipper clipper;
  ImVec2 triangle_2 [3];
  char buf [300];
  ImGuiListClipper local_1e8;
  ulong local_1d0;
  ImDrawList *local_1c8;
  ulong local_1c0;
  ImVec2 local_1b8 [4];
  undefined8 local_198;
  float fStack_190;
  undefined4 uStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  undefined4 uStack_17c;
  ImGuiContext *local_178;
  ImVec2 local_170;
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pcVar12 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar12 = draw_list->_OwnerName;
  }
  bVar6 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar12,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,(draw_list->CmdBuffer).Size);
  pIVar16 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->DrawList == draw_list) {
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar16->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar6) {
      return;
    }
  }
  else {
    local_1c8 = &pIVar16->ForegroundDrawList;
    if ((window != (ImGuiWindow *)0x0) && (bVar7 = IsItemHovered(0), bVar7)) {
      local_168[0].y = (window->Pos).y + (window->Size).y;
      local_168[0].x = (window->Pos).x + (window->Size).x;
      ImDrawList::AddRect(local_1c8,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
    }
    if (!bVar6) {
      return;
    }
    if ((window != (ImGuiWindow *)0x0) && (window->WasActive == false)) {
      TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
    }
    if (0 < (draw_list->CmdBuffer).Size) {
      pIVar17 = (draw_list->CmdBuffer).Data;
      uVar11 = 0;
      local_178 = pIVar16;
      do {
        if (pIVar17->UserCallback == (ImDrawCallback)0x0) {
          if (pIVar17->ElemCount != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              puVar19 = (unsigned_short *)0x0;
            }
            else {
              puVar19 = (draw_list->IdxBuffer).Data;
            }
            local_1d0 = uVar11;
            ImFormatString((char *)local_168,300,
                           "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           SUB84((double)(pIVar17->ClipRect).x,0),
                           SUB84((double)(pIVar17->ClipRect).y,0),(double)(pIVar17->ClipRect).z,
                           (double)(pIVar17->ClipRect).w,(ulong)pIVar17->ElemCount / 3,
                           pIVar17->TextureId);
            cVar8 = TreeNode((void *)(((long)pIVar17 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                     0x6db6db6db6db6db7),"%s",local_168);
            if ((show_drawcmd_details == true) &&
               (bVar6 = IsItemHovered(0), this = local_1c8, bVar6)) {
              local_1c0 = CONCAT71(local_1c0._1_7_,cVar8);
              uVar13 = pIVar17->ElemCount + (uint)local_1d0;
              if ((uint)local_1d0 < uVar13) {
                uVar11 = local_1d0 & 0xffffffff;
                fVar22 = -3.4028235e+38;
                fVar21 = -3.4028235e+38;
                fVar24 = 3.4028235e+38;
                fVar23 = 3.4028235e+38;
                do {
                  if (puVar19 == (unsigned_short *)0x0) {
                    uVar9 = (uint)uVar11;
                  }
                  else {
                    uVar9 = (uint)puVar19[uVar11];
                  }
                  if ((draw_list->VtxBuffer).Size <= (int)uVar9) {
LAB_001ead4b:
                    __assert_fail("i < Size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                                  ,0x503,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]"
                                 );
                  }
                  pIVar4 = (draw_list->VtxBuffer).Data;
                  fVar1 = pIVar4[(int)uVar9].pos.x;
                  fVar2 = pIVar4[(int)uVar9].pos.y;
                  fVar5 = fVar1;
                  if (fVar24 <= fVar1) {
                    fVar5 = fVar24;
                  }
                  fVar24 = fVar5;
                  fVar5 = fVar2;
                  if (fVar23 <= fVar2) {
                    fVar5 = fVar23;
                  }
                  fVar23 = fVar5;
                  if (fVar1 <= fVar22) {
                    fVar1 = fVar22;
                  }
                  fVar22 = fVar1;
                  if (fVar2 <= fVar21) {
                    fVar2 = fVar21;
                  }
                  fVar21 = fVar2;
                  uVar11 = uVar11 + 1;
                } while (uVar13 != uVar11);
                in_XMM6_Da = (float)(int)fVar24;
                in_XMM6_Db = 0.0;
                in_XMM4_Da = (float)(int)fVar23;
                in_XMM4_Db = 0;
                in_XMM7_Da = (float)(int)fVar22;
                in_XMM7_Db = 0.0;
                in_XMM5_Da = (float)(int)fVar21;
                in_XMM5_Db = 0;
              }
              local_198 = (ImDrawCmd *)CONCAT44(in_XMM4_Da,in_XMM6_Da);
              local_1e8.DisplayStart = (int)(float)(int)(pIVar17->ClipRect).x;
              local_1e8.DisplayEnd = (int)(float)(int)(pIVar17->ClipRect).y;
              local_1b8[0].y = (float)(int)(pIVar17->ClipRect).w;
              local_1b8[0].x = (float)(int)(pIVar17->ClipRect).z;
              fVar21 = in_XMM4_Da;
              fVar22 = in_XMM5_Da;
              fStack_190 = in_XMM6_Db;
              uStack_18c = in_XMM4_Db;
              local_188 = in_XMM7_Da;
              fStack_184 = in_XMM5_Da;
              fStack_180 = in_XMM7_Db;
              uStack_17c = in_XMM5_Db;
              ImDrawList::AddRect(local_1c8,(ImVec2 *)&local_1e8,local_1b8,0xffff00ff,0.0,0xf,1.0);
              local_1e8._0_8_ = local_198;
              local_1b8[0].y = fStack_184;
              local_1b8[0].x = local_188;
              ImDrawList::AddRect(this,(ImVec2 *)&local_1e8,local_1b8,0xff00ffff,0.0,0xf,1.0);
              in_XMM6_Db = fVar21;
              in_XMM7_Db = fVar22;
              cVar8 = (char)local_1c0;
            }
            uVar11 = local_1d0;
            if (cVar8 != '\0') {
              uVar13 = pIVar17->ElemCount;
              uVar9 = uVar13 + (uint)local_1d0;
              uVar20 = 0;
              if ((uint)local_1d0 < uVar9) {
                iVar18 = (draw_list->VtxBuffer).Size;
                uVar11 = local_1d0 & 0xffffffff;
                fVar21 = 0.0;
                do {
                  local_1e8._0_8_ = (ImDrawCmd *)0x0;
                  local_1e8.ItemsCount = 0;
                  local_1e8.StepNo = 0;
                  local_1e8.ItemsHeight = 0.0;
                  local_1e8.StartPosY = 0.0;
                  lVar14 = 0;
                  do {
                    uVar15 = (uint)(uVar11 + lVar14);
                    if (puVar19 != (unsigned_short *)0x0) {
                      uVar15 = (uint)puVar19[uVar11 + lVar14 & 0xffffffff];
                    }
                    if (iVar18 <= (int)uVar15) goto LAB_001ead4b;
                    *(ImVec2 *)(&local_1e8.DisplayStart + lVar14 * 2) =
                         (draw_list->VtxBuffer).Data[(int)uVar15].pos;
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 3);
                  in_XMM4_Db = 0;
                  in_XMM4_Da = ((float)local_1e8.StepNo - local_1e8.StartPosY) *
                               (float)local_1e8.DisplayStart +
                               (local_1e8.StartPosY - (float)local_1e8.DisplayEnd) *
                               (float)local_1e8.ItemsCount;
                  fVar21 = fVar21 + ABS(((float)local_1e8.DisplayEnd - (float)local_1e8.StepNo) *
                                        local_1e8.ItemsHeight + in_XMM4_Da) * 0.5;
                  uVar11 = uVar11 + 3;
                } while ((uint)uVar11 < uVar9);
                uVar20 = SUB84((double)fVar21,0);
              }
              ImFormatString((char *)local_168,300,
                             "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                             uVar20,(ulong)uVar13,(ulong)pIVar17->VtxOffset,
                             (ulong)pIVar17->IdxOffset);
              local_1e8.DisplayStart = 0;
              local_1e8.DisplayEnd = 0;
              Selectable((char *)local_168,false,0,(ImVec2 *)&local_1e8);
              bVar6 = IsItemHovered(0);
              if ((bVar6) && (show_drawcmd_details == true)) {
                uVar13 = (pIVar16->ForegroundDrawList).Flags;
                (pIVar16->ForegroundDrawList).Flags = uVar13 & 0xfffffffe;
                local_1e8.DisplayEnd = (int)(float)(int)(pIVar17->ClipRect).y;
                local_1e8.DisplayStart = (int)(float)(int)(pIVar17->ClipRect).x;
                local_1b8[0].y = (float)(int)(pIVar17->ClipRect).w;
                local_1b8[0].x = (float)(int)(pIVar17->ClipRect).z;
                ImDrawList::AddRect(local_1c8,(ImVec2 *)&local_1e8,local_1b8,0xffff00ff,0.0,0xf,1.0)
                ;
                if ((uint)local_1d0 < pIVar17->ElemCount + (uint)local_1d0) {
                  uVar11 = local_1d0 & 0xffffffff;
                  do {
                    local_1e8._0_8_ = (ImDrawCmd *)0x0;
                    local_1e8.ItemsCount = 0;
                    local_1e8.StepNo = 0;
                    local_1e8.ItemsHeight = 0.0;
                    local_1e8.StartPosY = 0.0;
                    iVar18 = (draw_list->VtxBuffer).Size;
                    lVar14 = 0;
                    do {
                      uVar9 = (uint)(uVar11 + lVar14);
                      if (puVar19 != (unsigned_short *)0x0) {
                        uVar9 = (uint)puVar19[uVar11 + lVar14 & 0xffffffff];
                      }
                      if (iVar18 <= (int)uVar9) goto LAB_001ead4b;
                      *(ImVec2 *)(&local_1e8.DisplayStart + lVar14 * 2) =
                           (draw_list->VtxBuffer).Data[(int)uVar9].pos;
                      lVar14 = lVar14 + 1;
                    } while (lVar14 != 3);
                    ImDrawList::AddPolyline(local_1c8,(ImVec2 *)&local_1e8,3,0xff00ffff,true,1.0);
                    uVar11 = uVar11 + 3;
                  } while ((uint)uVar11 < pIVar17->ElemCount + (int)local_1d0);
                }
                (pIVar16->ForegroundDrawList).Flags = uVar13;
              }
              local_1e8.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
              local_1e8.ItemsCount = pIVar17->ElemCount / 3;
              local_1e8.StepNo = 0;
              local_1e8.ItemsHeight = -1.0;
              local_1e8._0_8_ = (ImDrawCmd *)0xffffffffffffffff;
              local_198 = pIVar17;
              while (bVar6 = ImGuiListClipper::Step(&local_1e8), bVar6) {
                local_188 = (float)local_1e8.DisplayEnd;
                if (local_1e8.DisplayStart < local_1e8.DisplayEnd) {
                  iVar18 = local_1e8.DisplayStart * 3 + (int)local_1d0;
                  fVar21 = (float)local_1e8.DisplayStart;
                  do {
                    local_1c0 = (ulong)(uint)fVar21;
                    local_1b8[0].x = 0.0;
                    local_1b8[0].y = 0.0;
                    local_1b8[1].x = 0.0;
                    local_1b8[1].y = 0.0;
                    local_1b8[2].x = 0.0;
                    local_1b8[2].y = 0.0;
                    lVar14 = 0;
                    buf_00 = local_168;
                    do {
                      if (puVar19 == (unsigned_short *)0x0) {
                        uVar13 = iVar18 + (int)lVar14;
                      }
                      else {
                        uVar13 = (uint)puVar19[iVar18 + lVar14];
                      }
                      if ((draw_list->VtxBuffer).Size <= (int)uVar13) goto LAB_001ead4b;
                      pIVar4 = (draw_list->VtxBuffer).Data;
                      local_1b8[lVar14] = pIVar4[(int)uVar13].pos;
                      pcVar12 = "     ";
                      if (lVar14 == 0) {
                        pcVar12 = "Vert:";
                      }
                      iVar10 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                              "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                              ,SUB84((double)pIVar4[(int)uVar13].pos.x,0),
                                              SUB84((double)pIVar4[(int)uVar13].pos.y,0),
                                              (double)pIVar4[(int)uVar13].uv.x,
                                              (double)pIVar4[(int)uVar13].uv.y,pcVar12,
                                              (ulong)(uint)(iVar18 + (int)lVar14),
                                              (ulong)pIVar4[(int)uVar13].col);
                      buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar10);
                      lVar14 = lVar14 + 1;
                    } while (lVar14 != 3);
                    local_170.x = 0.0;
                    local_170.y = 0.0;
                    Selectable((char *)local_168,false,0,&local_170);
                    pIVar16 = local_178;
                    bVar6 = IsItemHovered(0);
                    if (bVar6) {
                      uVar13 = (pIVar16->ForegroundDrawList).Flags;
                      (pIVar16->ForegroundDrawList).Flags = uVar13 & 0xfffffffe;
                      ImDrawList::AddPolyline(local_1c8,local_1b8,3,0xff00ffff,true,1.0);
                      (pIVar16->ForegroundDrawList).Flags = uVar13;
                    }
                    iVar18 = iVar18 + 3;
                    fVar21 = (float)((int)local_1c0 + 1);
                  } while (fVar21 != local_188);
                }
              }
              TreePop();
              pIVar17 = local_198;
              uVar11 = local_1d0;
              if ((float)local_1e8.ItemsCount != -NAN) {
                __assert_fail("ItemsCount == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                              ,0x6d4,"ImGuiListClipper::~ImGuiListClipper()");
              }
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar17->UserCallback,pIVar17->UserCallbackData);
        }
        uVar11 = (ulong)((int)uVar11 + pIVar17->ElemCount);
        pIVar17 = pIVar17 + 1;
      } while (pIVar17 < (draw_list->CmdBuffer).Data + (draw_list->CmdBuffer).Size);
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_details && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
                    for (unsigned int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255,0,255,255));
                    fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (fg_draw_list && ImGui::IsItemHovered() && show_drawcmd_details)
                {
                    // Draw wire-frame version of everything
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    ImRect clip_rect = pcmd->ClipRect;
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255));
                    for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                    {
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++)
                            triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                        fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    }
                    fg_draw_list->Flags = backup_flags;
                }

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }